

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# life.h
# Opt level: O0

void __thiscall cell_map::cell_map(cell_map *this,int w,int h)

{
  value_type local_19;
  int local_18;
  int local_14;
  int h_local;
  int w_local;
  cell_map *this_local;
  
  this->width = w;
  this->height = h;
  local_18 = h;
  local_14 = w;
  _h_local = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&this->cells);
  local_19 = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->cells,(long)(local_14 * local_18),&local_19);
  return;
}

Assistant:

cell_map(int w, int h) : width(w), height(h)
    {
    cells.resize(w*h, 0);
    }